

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::
     dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
               (summarySampleslevelHeader *sh,
               vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *vrec,
               _func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp,
               OASIS_FLOAT max_impacted_exposure,OASIS_FLOAT mean_impacted_exposure,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  bool bVar1;
  mapped_type *__x;
  reference ppVar2;
  reference psVar3;
  double dVar4;
  float local_cc;
  OASIS_FLOAT x;
  OASIS_FLOAT sd;
  sampleslevelRec v;
  const_iterator __end4;
  const_iterator __begin4;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *__range4;
  period_occ p;
  iterator __end0;
  iterator __begin0;
  vector<period_occ,_std::allocator<period_occ>_> *__range2;
  float local_80;
  OASIS_FLOAT loss_sum;
  OASIS_FLOAT squared_loss_sum;
  outrec o;
  bool firsttime;
  bool hasrec;
  OASIS_FLOAT max_loss_local;
  OASIS_FLOAT chance_of_loss_local;
  OASIS_FLOAT mean_impacted_exposure_local;
  OASIS_FLOAT max_impacted_exposure_local;
  vector<period_occ,_std::allocator<period_occ>_> *vp_local;
  map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
  *m_occ_local;
  FILE *outFile_local;
  _func_void_outrec_ptr_int_FILE_ptr *OutputData_local;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *vrec_local;
  summarySampleslevelHeader *sh_local;
  
  o.occ_date_id = (int)max_loss;
  __x = std::
        map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
        ::operator[](m_occ,&sh->event_id);
  std::vector<period_occ,_std::allocator<period_occ>_>::operator=(vp,__x);
  o.max_loss._3_1_ = 0;
  o.max_loss._2_1_ = 1;
  o.summary_id = sh->event_id;
  squared_loss_sum = (OASIS_FLOAT)sh->summary_id;
  o.mean = sh->expval;
  o.mean_impact_exp = (OASIS_FLOAT)o.occ_date_id;
  o.period_no = 0;
  o.event_id = 0;
  local_80 = 0.0;
  __range2._4_4_ = 0.0;
  o.standard_deviation = max_impacted_exposure;
  o.exp_value = mean_impacted_exposure;
  o.max_impact_exp = chance_of_loss;
  __end0 = std::vector<period_occ,_std::allocator<period_occ>_>::begin(vp);
  p = (period_occ)std::vector<period_occ,_std::allocator<period_occ>_>::end(vp);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<period_occ_*,_std::vector<period_occ,_std::allocator<period_occ>_>_>
                                     *)&p), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<period_occ_*,_std::vector<period_occ,_std::allocator<period_occ>_>_>
             ::operator*(&__end0);
    __range4._0_4_ = (*ppVar2).period_no;
    o.type = (int)__range4;
    __range4._4_4_ = (OASIS_FLOAT)(*ppVar2).occ_date_id;
    o.chance_of_loss = __range4._4_4_;
    if ((o.max_loss._2_1_ & 1) == 1) {
      __end4 = std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::begin(vrec);
      v = (sampleslevelRec)std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::end(vrec)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_sampleslevelRec_*,_std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>_>
                                         *)&v), bVar1) {
        psVar3 = __gnu_cxx::
                 __normal_iterator<const_sampleslevelRec_*,_std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>_>
                 ::operator*(&__end4);
        x = (OASIS_FLOAT)(*psVar3).sidx;
        if (0 < (int)x) {
          o.max_loss._3_1_ = 1;
          sd = (*psVar3).loss;
          __range2._4_4_ = sd + __range2._4_4_;
          local_80 = sd * sd + local_80;
        }
        __gnu_cxx::
        __normal_iterator<const_sampleslevelRec_*,_std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>_>
        ::operator++(&__end4);
      }
      o.max_loss._2_1_ = 0;
    }
    if ((o.max_loss._3_1_ & 1) != 0) {
      o.period_no = (int)(__range2._4_4_ / (float)samplesize_);
      if (samplesize_ == 1) {
        o.event_id = 0;
      }
      else {
        local_cc = (local_80 - (__range2._4_4_ * __range2._4_4_) / (float)samplesize_) /
                   (float)(samplesize_ + -1);
        if (local_cc / local_80 < 1e-07) {
          local_cc = 0.0;
        }
        dVar4 = std::sqrt((double)(ulong)(uint)local_cc);
        o.event_id = SUB84(dVar4,0);
      }
      if ((0.0 < (float)o.period_no) || (0.0 < (float)o.event_id)) {
        (*OutputData)((outrec *)&loss_sum,2,outFile);
      }
    }
    __gnu_cxx::
    __normal_iterator<period_occ_*,_std::vector<period_occ,_std::allocator<period_occ>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void dopltcalc(const summarySampleslevelHeader& sh,
		       const std::vector<sampleslevelRec>& vrec,
		       void (*OutputData)(const outrecT&, const int, FILE*),
		       FILE * outFile, moccT &m_occ, std::vector<periodT> &vp,
		       const OASIS_FLOAT max_impacted_exposure,
		       const OASIS_FLOAT mean_impacted_exposure,
		       const OASIS_FLOAT chance_of_loss,
		       const OASIS_FLOAT max_loss)
	{
		vp = m_occ[sh.event_id];
		bool hasrec = false;
		bool firsttime = true;
		outrecT o;
		o.event_id = sh.event_id;
		o.summary_id = sh.summary_id;
		o.exp_value = sh.expval;
		o.max_impact_exp = max_impacted_exposure;
		o.mean_impact_exp = mean_impacted_exposure;
		o.chance_of_loss = chance_of_loss;
		o.max_loss = max_loss;
		o.mean = 0;
		o.standard_deviation = 0;

		OASIS_FLOAT squared_loss_sum = 0;
		OASIS_FLOAT loss_sum = 0;
		for (auto p : vp) {
			o.period_no = p.period_no;
			o.occ_date_id = p.occ_date_id;
			if (firsttime == true) { // only do this once
				for (auto v : vrec) {
					if (v.sidx > 0) {
						hasrec = true;
						loss_sum += v.loss;
						squared_loss_sum += (v.loss * v.loss);
					}
				}
				firsttime = false;
			}
			if (hasrec) {
				o.mean = loss_sum / samplesize_;
				if (samplesize_ != 1) {
					OASIS_FLOAT sd = (squared_loss_sum - ((loss_sum * loss_sum) / samplesize_)) / (samplesize_ - 1);
					OASIS_FLOAT x = sd / squared_loss_sum;
					if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
					o.standard_deviation = sqrt(sd);
				} else {
					o.standard_deviation = 0;
				}
				if (o.mean > 0 || o.standard_deviation > 0) {
					OutputData(o, 2, outFile);
				}
			}
		}
	}